

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnvisci.cpp
# Opt level: O3

void UConverter_toUnicode_ISCII_OFFSETS_LOGIC(UConverterToUnicodeArgs *args,UErrorCode *err)

{
  byte bVar1;
  char cVar2;
  undefined4 uVar3;
  UConverter *pUVar4;
  char *pcVar5;
  ushort *puVar6;
  UChar *pUVar7;
  int32_t *piVar8;
  UChar *pUVar9;
  UChar *pUVar10;
  uint uVar11;
  int iVar12;
  char *pcVar13;
  short sVar14;
  UChar UVar15;
  UChar UVar16;
  int iVar17;
  int *piVar18;
  ulong uVar19;
  long lVar20;
  int iVar21;
  uint uVar22;
  uint uVar23;
  char *pcVar24;
  byte *pbVar25;
  uint uVar26;
  uint32_t uVar27;
  UConverter *cnv;
  UConverter *pUVar28;
  long lVar29;
  int iVar30;
  ushort uVar31;
  UErrorCode local_60;
  
  pUVar4 = args->converter;
  if (pUVar4 == (UConverter *)0x0) {
    *err = U_ILLEGAL_ARGUMENT_ERROR;
  }
  else {
    pcVar5 = args->sourceLimit;
    pcVar24 = args->source;
    pUVar9 = args->target;
    puVar6 = (ushort *)pUVar4->extraInfo;
    local_60 = *err;
    pUVar28 = pUVar4;
    if (pcVar24 < pcVar5 && local_60 < U_ILLEGAL_ARGUMENT_ERROR) {
      pUVar7 = args->targetLimit;
      uVar26 = (uint)pcVar24;
      uVar11 = ~uVar26;
      iVar12 = -uVar26;
      pcVar13 = pcVar24;
      do {
        lVar20 = 0;
        while( true ) {
          if (pUVar7 <= pUVar9) {
            *err = U_BUFFER_OVERFLOW_ERROR;
            goto LAB_0016e3d4;
          }
          bVar1 = pcVar13[lVar20];
          uVar19 = (ulong)bVar1;
          uVar31 = *puVar6;
          uVar23 = (uint)bVar1;
          if (uVar31 != 0xef) break;
          if ((byte)(bVar1 + 0xbe) < 10) {
            puVar6[4] = (ushort)((int)lookupTable[uVar23 & 0xf] << 7);
            uVar23 = (uint)lookupTable[uVar23 & 0xf][1];
LAB_0016d834:
            *(uint *)(puVar6 + 8) = uVar23;
          }
          else {
            if (bVar1 == 0x40) {
              puVar6[4] = puVar6[2];
              uVar23 = *(uint *)(puVar6 + 10);
              goto LAB_0016d834;
            }
            if (0x1e < (byte)(bVar1 - 0x21)) {
              *err = U_ILLEGAL_CHAR_FOUND;
              *puVar6 = 0xfffe;
              goto LAB_0016e3b9;
            }
          }
          *puVar6 = 0xfffe;
          pcVar24 = pcVar13 + lVar20 + 1;
          lVar20 = lVar20 + 1;
          if (pcVar5 <= pcVar24) goto LAB_0016e3d0;
        }
        iVar21 = (int)pcVar13;
        iVar30 = (int)lVar20;
        if (uVar31 != 0xd9) {
          if (uVar31 != 0xf0) goto LAB_0016d9e2;
          if ((byte)(bVar1 + 0x5f) < 0x4e) {
            if ((uVar23 != 0xbf) && (uVar23 != 0xb8)) goto LAB_0016e3a1;
            sVar14 = 0x952;
            if (bVar1 == 0xbf) {
              sVar14 = 0x970;
            }
            pbVar25 = (uint8_t *)0x1f5e82;
            if (bVar1 == 0xbf) {
              pbVar25 = (uint8_t *)0x1f5ea0;
            }
            if ((*(uint *)(puVar6 + 8) & (uint)*pbVar25) == 0) goto LAB_0016e3a1;
            *puVar6 = 0xfffe;
            if (*(int *)(puVar6 + 0x16) != 0) {
              *pUVar9 = (UChar)*(int *)(puVar6 + 0x16);
              piVar18 = args->offsets;
              if (piVar18 != (int *)0x0) {
                args->offsets = piVar18 + 1;
                *piVar18 = (iVar21 - uVar26) + iVar30;
              }
              pUVar9 = pUVar9 + 1;
              puVar6[0x16] = 0;
              puVar6[0x17] = 0;
            }
            uVar31 = puVar6[4];
            if (pUVar9 < pUVar7) {
              *pUVar9 = sVar14 + uVar31;
              pUVar9 = pUVar9 + 1;
              piVar18 = args->offsets;
              if (piVar18 != (int *)0x0) {
                iVar21 = ~uVar26 + iVar30 + iVar21;
LAB_0016d931:
                args->offsets = piVar18 + 1;
                *piVar18 = iVar21;
              }
              goto LAB_0016e0d4;
            }
            cVar2 = pUVar4->UCharErrorBufferLength;
            pUVar4->UCharErrorBufferLength = cVar2 + '\x01';
            pUVar4->UCharErrorBuffer[cVar2] = sVar14 + uVar31;
LAB_0016e4cb:
            *err = U_BUFFER_OVERFLOW_ERROR;
            pcVar13 = pcVar13 + lVar20 + 1;
            goto LAB_0016e3d4;
          }
          *puVar6 = 0xfffe;
          *err = U_ILLEGAL_CHAR_FOUND;
LAB_0016e3b9:
          pUVar4->toUBytes[0] = bVar1;
          pUVar28 = args->converter;
          pUVar28->toULength = '\x01';
          local_60 = *err;
          pcVar24 = pcVar13 + lVar20 + 1;
          break;
        }
        if (*(int *)(puVar6 + 0x16) != 0) {
          *pUVar9 = (UChar)*(int *)(puVar6 + 0x16);
          piVar18 = args->offsets;
          if (piVar18 != (int *)0x0) {
            args->offsets = piVar18 + 1;
            *piVar18 = (iVar21 - uVar26) + iVar30;
          }
          pUVar9 = pUVar9 + 1;
          puVar6[0x16] = 0;
          puVar6[0x17] = 0;
        }
        UVar16 = L'\x200d';
        if (bVar1 == 0xe8) {
          UVar16 = L' ';
        }
        if (pUVar9 < pUVar7) {
          *pUVar9 = UVar16;
          pUVar9 = pUVar9 + 1;
          piVar18 = args->offsets;
          if (piVar18 != (int *)0x0) {
            args->offsets = piVar18 + 1;
            *piVar18 = ~uVar26 + iVar30 + iVar21;
          }
        }
        else {
          cVar2 = pUVar4->UCharErrorBufferLength;
          pUVar4->UCharErrorBufferLength = cVar2 + '\x01';
          pUVar4->UCharErrorBuffer[cVar2] = UVar16;
          *err = U_BUFFER_OVERFLOW_ERROR;
          local_60 = U_BUFFER_OVERFLOW_ERROR;
        }
        *puVar6 = 0xfffe;
        uVar31 = 0xfffe;
LAB_0016d9e2:
        if (uVar23 < 0xe0) {
          if ((uVar23 == 10) || (uVar23 == 0xd)) {
            *(undefined1 *)((long)puVar6 + 0x19) = 1;
            uVar23 = (uint)toUnicodeTable[uVar19];
            goto LAB_0016dd92;
          }
          if (uVar23 == 0xd9) goto switchD_0016da07_caseD_ef;
switchD_0016da07_caseD_eb:
          uVar23 = (uint)toUnicodeTable[uVar19];
          if ((0xa0 < bVar1) &&
             ((*(uint *)(puVar6 + 8) & (uint)""[toUnicodeTable[uVar19] & 0x7f]) == 0)) {
            if (bVar1 != 0xd0) {
              uVar23 = 0xffff;
            }
            if (puVar6[4] != 0x300) {
              uVar23 = 0xffff;
            }
          }
          goto LAB_0016dd92;
        }
        switch(bVar1) {
        case 0xe8:
          if (uVar31 == 0xe8) {
            uVar23 = 0x200c;
LAB_0016db3b:
            uVar19 = 0xfffe;
          }
          else {
            uVar23 = 0x94d;
            if ((char)puVar6[8] == '\0') {
              uVar23 = 0xffff;
            }
            uVar19 = 0xe8;
          }
          break;
        case 0xe9:
          if (uVar31 == 0xe8) {
            uVar23 = 0x200d;
            goto LAB_0016db3b;
          }
          uVar3 = *(undefined4 *)(puVar6 + 4);
          if (uVar31 != 0xc0 || (short)uVar3 != 0x100) {
            lVar29 = 0;
            do {
              if (nuktaSpecialCases[lVar29 + 1][0] == (uVar31 & 0xff)) {
                UVar16 = nuktaSpecialCases[lVar29 + 1][1];
                uVar23 = (uint)(ushort)UVar16;
                if ((*(uint *)(puVar6 + 8) & (uint)""[(byte)UVar16]) != 0) {
                  *puVar6 = 0xfffe;
                  pUVar4->toUnicodeStatus = 0xffff;
                  if ((short)uVar3 != 0x100) goto LAB_0016e022;
                  if (*(int *)(puVar6 + 0x16) != 0) {
                    UVar15 = (UChar)*(int *)(puVar6 + 0x16);
                    if (pUVar9 < pUVar7) {
                      *pUVar9 = UVar15;
                      pUVar9 = pUVar9 + 1;
                      piVar18 = args->offsets;
                      if (piVar18 != (int *)0x0) {
                        args->offsets = piVar18 + 1;
                        *piVar18 = iVar12 + iVar21 + iVar30;
                      }
                    }
                    else {
                      cVar2 = pUVar4->UCharErrorBufferLength;
                      pUVar4->UCharErrorBufferLength = cVar2 + '\x01';
                      pUVar4->UCharErrorBuffer[cVar2] = UVar15;
                      *err = U_BUFFER_OVERFLOW_ERROR;
                      local_60 = U_BUFFER_OVERFLOW_ERROR;
                    }
                    puVar6[0x16] = 0;
                    puVar6[0x17] = 0;
                  }
                  uVar23 = (uint)(ushort)UVar16;
                  if (((0xa0 < uVar23) && (1 < uVar23 - 0x964)) && (1 < uVar23 - 0x200c)) {
                    UVar16 = UVar16 + L'Ā';
                  }
                  if (pUVar7 <= pUVar9) {
                    cVar2 = pUVar4->UCharErrorBufferLength;
                    pUVar4->UCharErrorBufferLength = cVar2 + '\x01';
                    pUVar4->UCharErrorBuffer[cVar2] = UVar16;
                    goto LAB_0016e4cb;
                  }
                  *pUVar9 = UVar16;
                  pUVar9 = pUVar9 + 1;
                  piVar18 = args->offsets;
                  if (piVar18 == (int *)0x0) goto LAB_0016e0d4;
                  iVar21 = uVar11 + iVar21 + iVar30;
                  goto LAB_0016d931;
                }
                break;
              }
              lVar29 = lVar29 + 1;
            } while (lVar29 != 0xf);
            goto switchD_0016da07_caseD_eb;
          }
          pUVar10 = pUVar9;
          if (*(int *)(puVar6 + 0x16) != 0) {
            UVar16 = (UChar)*(int *)(puVar6 + 0x16);
            if (pUVar9 < pUVar7) {
              *pUVar9 = UVar16;
              pUVar9 = pUVar9 + 1;
              piVar18 = args->offsets;
              if (piVar18 != (int *)0x0) {
                args->offsets = piVar18 + 1;
                *piVar18 = iVar12 + iVar21 + iVar30;
              }
            }
            else {
              cVar2 = pUVar4->UCharErrorBufferLength;
              pUVar4->UCharErrorBufferLength = cVar2 + '\x01';
              pUVar4->UCharErrorBuffer[cVar2] = UVar16;
              *err = U_BUFFER_OVERFLOW_ERROR;
              local_60 = U_BUFFER_OVERFLOW_ERROR;
            }
            puVar6[0x16] = 0;
            puVar6[0x17] = 0;
            pUVar10 = pUVar9;
          }
          if (pUVar10 < pUVar7) {
            *pUVar10 = L'ੜ';
            piVar18 = args->offsets;
            if (piVar18 != (int *)0x0) {
              args->offsets = piVar18 + 1;
              *piVar18 = uVar11 + iVar21 + iVar30;
            }
            pUVar9 = pUVar10 + 1;
            if (U_ZERO_ERROR < local_60) goto LAB_0016e1c2;
            if (pUVar9 < pUVar7) {
              pUVar10[1] = L'੍';
              piVar18 = args->offsets;
              if (piVar18 != (int *)0x0) {
                args->offsets = piVar18 + 1;
                *piVar18 = uVar11 + iVar21 + iVar30;
              }
              pUVar9 = pUVar10 + 2;
              if (pUVar7 <= pUVar9) {
                cVar2 = pUVar4->UCharErrorBufferLength;
                pUVar4->UCharErrorBufferLength = cVar2 + '\x01';
                pUVar4->UCharErrorBuffer[cVar2] = L'ਹ';
                *err = U_BUFFER_OVERFLOW_ERROR;
                goto LAB_0016e354;
              }
              pUVar10[2] = L'ਹ';
              pUVar9 = pUVar10 + 3;
              piVar18 = args->offsets;
              if (piVar18 != (int *)0x0) {
                args->offsets = piVar18 + 1;
                *piVar18 = uVar11 + iVar21 + iVar30;
              }
            }
            else {
              cVar2 = pUVar4->UCharErrorBufferLength;
              pUVar4->UCharErrorBufferLength = cVar2 + '\x01';
              pUVar4->UCharErrorBuffer[cVar2] = L'੍';
              *err = U_BUFFER_OVERFLOW_ERROR;
              pUVar4->UCharErrorBufferLength = cVar2 + '\x02';
              pUVar4->UCharErrorBuffer[(char)(cVar2 + '\x01')] = L'ਹ';
LAB_0016e354:
              local_60 = U_BUFFER_OVERFLOW_ERROR;
            }
          }
          else {
            cVar2 = pUVar4->UCharErrorBufferLength;
            pUVar4->UCharErrorBufferLength = cVar2 + '\x01';
            pUVar4->UCharErrorBuffer[cVar2] = L'ੜ';
            *err = U_BUFFER_OVERFLOW_ERROR;
            local_60 = U_BUFFER_OVERFLOW_ERROR;
            pUVar9 = pUVar10;
LAB_0016e1c2:
            cVar2 = pUVar4->UCharErrorBufferLength;
            pUVar4->UCharErrorBuffer[cVar2] = L'੍';
            pUVar4->UCharErrorBufferLength = cVar2 + '\x02';
            pUVar4->UCharErrorBuffer[(char)(cVar2 + '\x01')] = L'ਹ';
          }
          pUVar4->toUnicodeStatus = 0xffff;
          *puVar6 = 0xfffe;
          goto LAB_0016e0d4;
        case 0xea:
          uVar23 = 0x965;
          if (uVar31 != 0xea) {
            uVar23 = 0x964;
            if ((puVar6[8] & 0x80) == 0) {
              uVar23 = 0xffff;
            }
            uVar19 = 0xea;
            break;
          }
LAB_0016db13:
          *puVar6 = 0xfffe;
          goto LAB_0016e02f;
        case 0xeb:
        case 0xec:
        case 0xed:
        case 0xee:
          goto switchD_0016da07_caseD_eb;
        case 0xef:
        case 0xf0:
switchD_0016da07_caseD_ef:
          *puVar6 = (ushort)bVar1;
          uVar27 = pUVar4->toUnicodeStatus;
          if (uVar27 == 0xffff) goto LAB_0016e0d4;
          if (*(int *)(puVar6 + 0x16) != 0) {
            UVar16 = (UChar)*(int *)(puVar6 + 0x16);
            if (pUVar9 < pUVar7) {
              *pUVar9 = UVar16;
              pUVar9 = pUVar9 + 1;
              piVar18 = args->offsets;
              if (piVar18 != (int *)0x0) {
                args->offsets = piVar18 + 1;
                *piVar18 = iVar12 + iVar21 + iVar30;
              }
            }
            else {
              cVar2 = pUVar4->UCharErrorBufferLength;
              pUVar4->UCharErrorBufferLength = cVar2 + '\x01';
              pUVar4->UCharErrorBuffer[cVar2] = UVar16;
              *err = U_BUFFER_OVERFLOW_ERROR;
              local_60 = U_BUFFER_OVERFLOW_ERROR;
            }
            puVar6[0x16] = 0;
            puVar6[0x17] = 0;
            uVar27 = pUVar4->toUnicodeStatus;
          }
          if (((0xa0 < (int)uVar27) && (1 < uVar27 - 0x964)) && (1 < uVar27 - 0x200c)) {
            uVar27 = uVar27 + puVar6[4];
          }
          if (pUVar9 < pUVar7) {
            *pUVar9 = (UChar)uVar27;
            pUVar9 = pUVar9 + 1;
            piVar18 = args->offsets;
            if (piVar18 != (int *)0x0) {
              args->offsets = piVar18 + 1;
              *piVar18 = uVar11 + iVar21 + iVar30;
            }
          }
          else {
            cVar2 = pUVar4->UCharErrorBufferLength;
            pUVar4->UCharErrorBufferLength = cVar2 + '\x01';
            pUVar4->UCharErrorBuffer[cVar2] = (UChar)uVar27;
            *err = U_BUFFER_OVERFLOW_ERROR;
            local_60 = U_BUFFER_OVERFLOW_ERROR;
          }
          goto LAB_0016e0cd;
        default:
          if (uVar23 != 0xe0) goto switchD_0016da07_caseD_eb;
          uVar23 = 0x904;
          if ((char)*(uint *)(puVar6 + 8) < '\0' && (char)uVar31 == -0x5c) goto LAB_0016db13;
          uVar23 = 0x946;
          if ((*(uint *)(puVar6 + 8) & 0x87) == 0) {
            uVar23 = 0xffff;
          }
          uVar19 = 0xe0;
        }
LAB_0016dd92:
        *puVar6 = (ushort)uVar19;
        if (pUVar4->toUnicodeStatus == 0xffff) {
LAB_0016e022:
          if (uVar23 == 0xffff) {
LAB_0016e3a1:
            *err = U_INVALID_CHAR_FOUND;
            goto LAB_0016e3b9;
          }
LAB_0016e02f:
          pUVar4->toUnicodeStatus = uVar23;
          if (*(char *)((long)puVar6 + 0x19) == '\x01') {
            puVar6[4] = puVar6[2];
            *(undefined4 *)(puVar6 + 8) = *(undefined4 *)(puVar6 + 10);
            *(undefined1 *)((long)puVar6 + 0x19) = 0;
          }
        }
        else {
          uVar22 = (uint)puVar6[4];
          iVar17 = *(int *)(puVar6 + 0x16);
          if (0x4f < iVar17 - 0xa00U || uVar22 != 0x100) {
            pUVar10 = pUVar9;
            if (iVar17 != 0) goto LAB_0016de70;
LAB_0016ded3:
            pUVar9 = pUVar10;
            if ((uVar22 == 0x100) && (uVar23 == 0x902)) {
              uVar27 = pUVar4->toUnicodeStatus;
              if ((uVar27 - 0x950 < 0xffffffb0) || (""[uVar27 - 0x900] < 2)) {
LAB_0016df9d:
                if ((0xa0 < (int)uVar27) && ((1 < uVar27 - 0x964 && (1 < uVar27 - 0x200c)))) {
                  uVar27 = uVar27 + uVar22;
                  pUVar4->toUnicodeStatus = uVar27;
                }
                if (pUVar7 <= pUVar10) {
                  cVar2 = pUVar4->UCharErrorBufferLength;
                  pUVar4->UCharErrorBufferLength = cVar2 + '\x01';
                  pUVar4->UCharErrorBuffer[cVar2] = (UChar)uVar27;
                  *err = U_BUFFER_OVERFLOW_ERROR;
                  goto LAB_0016e013;
                }
                *pUVar10 = (UChar)uVar27;
                piVar18 = args->offsets;
                pUVar9 = pUVar10 + 1;
                if (piVar18 != (int *)0x0) {
                  args->offsets = piVar18 + 1;
                  goto LAB_0016dfed;
                }
              }
              else {
                UVar16 = (short)uVar27 + L'Ā';
                if (pUVar10 < pUVar7) {
                  *pUVar10 = UVar16;
                  piVar18 = args->offsets;
                  uVar23 = 0x970;
                  pUVar9 = pUVar10 + 1;
                  if (piVar18 == (int *)0x0) goto LAB_0016e01b;
                  args->offsets = piVar18 + 1;
                  uVar23 = 0x970;
LAB_0016dfed:
                  *piVar18 = uVar11 + iVar21 + iVar30;
                  pUVar9 = pUVar10 + 1;
                }
                else {
                  cVar2 = pUVar4->UCharErrorBufferLength;
                  pUVar4->UCharErrorBufferLength = cVar2 + '\x01';
                  pUVar4->UCharErrorBuffer[cVar2] = UVar16;
                  *err = U_BUFFER_OVERFLOW_ERROR;
                  uVar23 = 0x970;
LAB_0016e013:
                  local_60 = U_BUFFER_OVERFLOW_ERROR;
                }
              }
            }
            else {
              uVar27 = pUVar4->toUnicodeStatus;
              if (((uVar22 != 0x100) || ((uVar23 != 0x94d || (uVar27 - 0x950 < 0xffffffb0)))) ||
                 ((""[uVar27 - 0x900] & 1) == 0)) goto LAB_0016df9d;
              *(uint32_t *)(puVar6 + 0x16) = uVar27 + 0x100;
              uVar23 = 0x94d;
            }
LAB_0016e01b:
            pUVar4->toUnicodeStatus = 0xffff;
            goto LAB_0016e022;
          }
          if (((pUVar4->toUnicodeStatus != 0x94d) || ((""[iVar17 - 0xa00U] & 1) == 0)) ||
             (uVar23 + 0x100 != iVar17)) {
LAB_0016de70:
            if (pUVar9 < pUVar7) {
              *pUVar9 = (UChar)iVar17;
              pUVar9 = pUVar9 + 1;
              piVar18 = args->offsets;
              if (piVar18 != (int *)0x0) {
                args->offsets = piVar18 + 1;
                *piVar18 = iVar12 + iVar21 + iVar30;
              }
            }
            else {
              cVar2 = pUVar4->UCharErrorBufferLength;
              pUVar4->UCharErrorBufferLength = cVar2 + '\x01';
              pUVar4->UCharErrorBuffer[cVar2] = (UChar)iVar17;
              *err = U_BUFFER_OVERFLOW_ERROR;
              local_60 = U_BUFFER_OVERFLOW_ERROR;
            }
            puVar6[0x16] = 0;
            puVar6[0x17] = 0;
            pUVar10 = pUVar9;
            goto LAB_0016ded3;
          }
          iVar30 = (-2 - uVar26) + iVar21 + iVar30;
          if (pUVar9 < pUVar7) {
            *pUVar9 = L'ੱ';
            pUVar9 = pUVar9 + 1;
            piVar8 = args->offsets;
            if (piVar8 != (int32_t *)0x0) {
              args->offsets = piVar8 + 1;
              *piVar8 = iVar30;
              iVar17 = *(int *)(puVar6 + 0x16);
            }
          }
          else {
            cVar2 = pUVar4->UCharErrorBufferLength;
            pUVar4->UCharErrorBufferLength = cVar2 + '\x01';
            pUVar4->UCharErrorBuffer[cVar2] = L'ੱ';
            *err = U_BUFFER_OVERFLOW_ERROR;
            local_60 = U_BUFFER_OVERFLOW_ERROR;
          }
          if (pUVar9 < pUVar7) {
            *pUVar9 = (UChar)iVar17;
            pUVar9 = pUVar9 + 1;
            piVar8 = args->offsets;
            if (piVar8 != (int32_t *)0x0) {
              args->offsets = piVar8 + 1;
              *piVar8 = iVar30;
            }
          }
          else {
            cVar2 = pUVar4->UCharErrorBufferLength;
            pUVar4->UCharErrorBufferLength = cVar2 + '\x01';
            pUVar4->UCharErrorBuffer[cVar2] = (UChar)iVar17;
            *err = U_BUFFER_OVERFLOW_ERROR;
            local_60 = U_BUFFER_OVERFLOW_ERROR;
          }
          puVar6[0x16] = 0;
          puVar6[0x17] = 0;
LAB_0016e0cd:
          pUVar4->toUnicodeStatus = 0xffff;
        }
LAB_0016e0d4:
        pcVar24 = pcVar13 + lVar20 + 1;
        if ((U_ZERO_ERROR < local_60) || (pcVar13 = pcVar24, pcVar5 <= pcVar24)) break;
      } while( true );
    }
LAB_0016e3d0:
    pcVar13 = pcVar24;
    if (((local_60 < U_ILLEGAL_ARGUMENT_ERROR) && (args->flush != '\0')) && (pcVar24 == pcVar5)) {
      uVar11 = *puVar6 - 0xd9;
      if ((uVar11 < 0x18) && ((0xc00001U >> (uVar11 & 0x1f) & 1) != 0)) {
        pUVar28->toUBytes[0] = (uint8_t)*puVar6;
        pUVar28->toULength = '\x01';
        *puVar6 = 0xfffe;
      }
      else {
        pUVar28->toULength = '\0';
      }
      uVar27 = pUVar4->toUnicodeStatus;
      if (uVar27 != 0xffff) {
        if (((0xa0 < (int)uVar27) && (1 < uVar27 - 0x964)) && (1 < uVar27 - 0x200c)) {
          uVar27 = uVar27 + puVar6[4];
        }
        if (pUVar9 < args->targetLimit) {
          *pUVar9 = (UChar)uVar27;
          pUVar9 = pUVar9 + 1;
          piVar8 = args->offsets;
          if (piVar8 != (int32_t *)0x0) {
            args->offsets = piVar8 + 1;
            *piVar8 = (int)pcVar5 + ~*(uint *)&args->source;
          }
        }
        else {
          pUVar28 = args->converter;
          cVar2 = pUVar28->UCharErrorBufferLength;
          pUVar28->UCharErrorBufferLength = cVar2 + '\x01';
          pUVar28->UCharErrorBuffer[cVar2] = (UChar)uVar27;
          *err = U_BUFFER_OVERFLOW_ERROR;
        }
        pUVar4->toUnicodeStatus = 0xffff;
      }
    }
LAB_0016e3d4:
    args->target = pUVar9;
    args->source = pcVar13;
  }
  return;
}

Assistant:

static void U_CALLCONV
UConverter_toUnicode_ISCII_OFFSETS_LOGIC(UConverterToUnicodeArgs *args, UErrorCode* err) {
    const char *source = ( char *) args->source;
    UChar *target = args->target;
    const char *sourceLimit = args->sourceLimit;
    const UChar* targetLimit = args->targetLimit;
    uint32_t targetUniChar = 0x0000;
    uint8_t sourceChar = 0x0000;
    UConverterDataISCII* data;
    UChar32* toUnicodeStatus=NULL;
    UChar32 tempTargetUniChar = 0x0000;
    UChar* contextCharToUnicode= NULL;
    UBool found;
    int i; 
    int offset = 0;

    if ((args->converter == NULL) || (target < args->target) || (source < args->source)) {
        *err = U_ILLEGAL_ARGUMENT_ERROR;
        return;
    }

    data = (UConverterDataISCII*)(args->converter->extraInfo);
    contextCharToUnicode = &data->contextCharToUnicode; /* contains previous ISCII codepoint visited */
    toUnicodeStatus = (UChar32*)&args->converter->toUnicodeStatus;/* contains the mapping to Unicode of the above codepoint*/

    while (U_SUCCESS(*err) && source<sourceLimit) {

        targetUniChar = missingCharMarker;

        if (target < targetLimit) {
            sourceChar = (unsigned char)*(source)++;

            /* look at the post-context preform special processing */
            if (*contextCharToUnicode==ATR) {

                /* If we have ATR in *contextCharToUnicode then we need to change our
                 * state to the Indic Script specified by sourceChar
                 */

                /* check if the sourceChar is supported script range*/
                if ((uint8_t)(PNJ-sourceChar)<=PNJ-DEV) {
                    data->currentDeltaToUnicode = (uint16_t)(lookupTable[sourceChar & 0x0F][0] * DELTA);
                    data->currentMaskToUnicode = (MaskEnum)lookupTable[sourceChar & 0x0F][1];
                } else if (sourceChar==DEF) {
                    /* switch back to default */
                    data->currentDeltaToUnicode = data->defDeltaToUnicode;
                    data->currentMaskToUnicode = data->defMaskToUnicode;
                } else {
                    if ((sourceChar >= 0x21 && sourceChar <= 0x3F)) {
                        /* these are display codes consume and continue */
                    } else {
                        *err =U_ILLEGAL_CHAR_FOUND;
                        /* reset */
                        *contextCharToUnicode=NO_CHAR_MARKER;
                        goto CALLBACK;
                    }
                }

                /* reset */
                *contextCharToUnicode=NO_CHAR_MARKER;

                continue;

            } else if (*contextCharToUnicode==EXT) {
                /* check if sourceChar is in 0xA1-0xEE range */
                if ((uint8_t) (EXT_RANGE_END - sourceChar) <= (EXT_RANGE_END - EXT_RANGE_BEGIN)) {
                    /* We currently support only Anudatta and Devanagari abbreviation sign */
                    if (sourceChar==0xBF || sourceChar == 0xB8) {
                        targetUniChar = (sourceChar==0xBF) ? DEV_ABBR_SIGN : DEV_ANUDATTA;
                        
                        /* find out if the mapping is valid in this state */
                        if (validityTable[(uint8_t)targetUniChar] & data->currentMaskToUnicode) {
                            *contextCharToUnicode= NO_CHAR_MARKER;

                            /* Write the previous toUnicodeStatus, this was delayed to handle consonant clustering for Gurmukhi script. */
                            if (data->prevToUnicodeStatus) {
                                WRITE_TO_TARGET_TO_U(args,source,target,args->offsets,(source-args->source -1),data->prevToUnicodeStatus,0,err);
                                data->prevToUnicodeStatus = 0x0000;
                            }
                            /* write to target */
                            WRITE_TO_TARGET_TO_U(args,source,target,args->offsets,(source-args->source -2),targetUniChar,data->currentDeltaToUnicode,err);

                            continue;
                        }
                    }
                    /* byte unit is unassigned */
                    targetUniChar = missingCharMarker;
                    *err= U_INVALID_CHAR_FOUND;
                } else {
                    /* only 0xA1 - 0xEE are legal after EXT char */
                    *contextCharToUnicode= NO_CHAR_MARKER;
                    *err = U_ILLEGAL_CHAR_FOUND;
                }
                goto CALLBACK;
            } else if (*contextCharToUnicode==ISCII_INV) {
                if (sourceChar==ISCII_HALANT) {
                    targetUniChar = 0x0020; /* replace with space accoding to Indic FAQ */
                } else {
                    targetUniChar = ZWJ;
                }

                /* Write the previous toUnicodeStatus, this was delayed to handle consonant clustering for Gurmukhi script. */
                if (data->prevToUnicodeStatus) {
                    WRITE_TO_TARGET_TO_U(args,source,target,args->offsets,(source-args->source -1),data->prevToUnicodeStatus,0,err);
                    data->prevToUnicodeStatus = 0x0000;
                }
                /* write to target */
                WRITE_TO_TARGET_TO_U(args,source,target,args->offsets,(source-args->source -2),targetUniChar,data->currentDeltaToUnicode,err);
                /* reset */
                *contextCharToUnicode=NO_CHAR_MARKER;
            }

            /* look at the pre-context and perform special processing */
            switch (sourceChar) {
            case ISCII_INV:
            case EXT:
            case ATR:
                *contextCharToUnicode = (UChar)sourceChar;

                if (*toUnicodeStatus != missingCharMarker) {
                    /* Write the previous toUnicodeStatus, this was delayed to handle consonant clustering for Gurmukhi script. */
                    if (data->prevToUnicodeStatus) {
                        WRITE_TO_TARGET_TO_U(args,source,target,args->offsets,(source-args->source -1),data->prevToUnicodeStatus,0,err);
                        data->prevToUnicodeStatus = 0x0000;
                    }
                    WRITE_TO_TARGET_TO_U(args,source,target,args->offsets,(source-args->source -2),*toUnicodeStatus,data->currentDeltaToUnicode,err);
                    *toUnicodeStatus = missingCharMarker;
                }
                continue;
            case ISCII_DANDA:
                /* handle double danda*/
                if (*contextCharToUnicode== ISCII_DANDA) {
                    targetUniChar = DOUBLE_DANDA;
                    /* clear the context */
                    *contextCharToUnicode = NO_CHAR_MARKER;
                    *toUnicodeStatus = missingCharMarker;
                } else {
                    GET_MAPPING(sourceChar,targetUniChar,data);
                    *contextCharToUnicode = sourceChar;
                }
                break;
            case ISCII_HALANT:
                /* handle explicit halant */
                if (*contextCharToUnicode == ISCII_HALANT) {
                    targetUniChar = ZWNJ;
                    /* clear the context */
                    *contextCharToUnicode = NO_CHAR_MARKER;
                } else {
                    GET_MAPPING(sourceChar,targetUniChar,data);
                    *contextCharToUnicode = sourceChar;
                }
                break;
            case 0x0A:
            case 0x0D:
                data->resetToDefaultToUnicode = TRUE;
                GET_MAPPING(sourceChar,targetUniChar,data)
                ;
                *contextCharToUnicode = sourceChar;
                break;

            case ISCII_VOWEL_SIGN_E:
                i=1;
                found=FALSE;
                for (; i<vowelSignESpecialCases[0][0]; i++) {
                    U_ASSERT(i<UPRV_LENGTHOF(vowelSignESpecialCases));
                    if (vowelSignESpecialCases[i][0]==(uint8_t)*contextCharToUnicode) {
                        targetUniChar=vowelSignESpecialCases[i][1];
                        found=TRUE;
                        break;
                    }
                }
                if (found) {
                    /* find out if the mapping is valid in this state */
                    if (validityTable[(uint8_t)targetUniChar] & data->currentMaskToUnicode) {
                        /*targetUniChar += data->currentDeltaToUnicode ;*/
                        *contextCharToUnicode= NO_CHAR_MARKER;
                        *toUnicodeStatus = missingCharMarker;
                        break;
                    }
                }
                GET_MAPPING(sourceChar,targetUniChar,data);
                *contextCharToUnicode = sourceChar;
                break;

            case ISCII_NUKTA:
                /* handle soft halant */
                if (*contextCharToUnicode == ISCII_HALANT) {
                    targetUniChar = ZWJ;
                    /* clear the context */
                    *contextCharToUnicode = NO_CHAR_MARKER;
                    break;
                } else if (data->currentDeltaToUnicode == PNJ_DELTA && data->contextCharToUnicode == 0xc0) {
                    /* Write the previous toUnicodeStatus, this was delayed to handle consonant clustering for Gurmukhi script. */
                    if (data->prevToUnicodeStatus) {
                        WRITE_TO_TARGET_TO_U(args,source,target,args->offsets,(source-args->source -1),data->prevToUnicodeStatus,0,err);
                        data->prevToUnicodeStatus = 0x0000;
                    }
                    /* We got here because ISCII_NUKTA was preceded by 0xc0 and we are converting Gurmukhi.
                     * In that case we must convert (0xc0 0xe9) to (\u0a5c\u0a4d\u0a39).
                     */
                    targetUniChar = PNJ_RRA;
                    WRITE_TO_TARGET_TO_U(args, source, target, args->offsets, (source-args->source)-2, targetUniChar, 0, err);
                    if (U_SUCCESS(*err)) {
                        targetUniChar = PNJ_SIGN_VIRAMA;
                        WRITE_TO_TARGET_TO_U(args, source, target, args->offsets, (source-args->source)-2, targetUniChar, 0, err);
                        if (U_SUCCESS(*err)) {
                            targetUniChar = PNJ_HA;
                            WRITE_TO_TARGET_TO_U(args, source, target, args->offsets, (source-args->source)-2, targetUniChar, 0, err);
                        } else {
                            args->converter->UCharErrorBuffer[args->converter->UCharErrorBufferLength++]= PNJ_HA;
                        }
                    } else {
                        args->converter->UCharErrorBuffer[args->converter->UCharErrorBufferLength++]= PNJ_SIGN_VIRAMA;
                        args->converter->UCharErrorBuffer[args->converter->UCharErrorBufferLength++]= PNJ_HA;
                    }
                    *toUnicodeStatus = missingCharMarker;
                    data->contextCharToUnicode = NO_CHAR_MARKER;
                    continue;
                } else {
                    /* try to handle <CHAR> + ISCII_NUKTA special mappings */
                    i=1;
                    found =FALSE;
                    for (; i<nuktaSpecialCases[0][0]; i++) {
                        if (nuktaSpecialCases[i][0]==(uint8_t)
                                *contextCharToUnicode) {
                            targetUniChar=nuktaSpecialCases[i][1];
                            found =TRUE;
                            break;
                        }
                    }
                    if (found) {
                        /* find out if the mapping is valid in this state */
                        if (validityTable[(uint8_t)targetUniChar] & data->currentMaskToUnicode) {
                            /*targetUniChar += data->currentDeltaToUnicode ;*/
                            *contextCharToUnicode= NO_CHAR_MARKER;
                            *toUnicodeStatus = missingCharMarker;
                            if (data->currentDeltaToUnicode == PNJ_DELTA) {
                                /* Write the previous toUnicodeStatus, this was delayed to handle consonant clustering for Gurmukhi script. */
                                if (data->prevToUnicodeStatus) {
                                    WRITE_TO_TARGET_TO_U(args,source,target,args->offsets,(source-args->source -1),data->prevToUnicodeStatus,0,err);
                                    data->prevToUnicodeStatus = 0x0000;
                                }
                                WRITE_TO_TARGET_TO_U(args,source,target,args->offsets,(source-args->source -2),targetUniChar,data->currentDeltaToUnicode,err);
                                continue;
                            }
                            break;
                        }
                        /* else fall through to default */
                    }
                    /* else fall through to default */
                    U_FALLTHROUGH;
                }
            default:GET_MAPPING(sourceChar,targetUniChar,data)
                ;
                *contextCharToUnicode = sourceChar;
                break;
            }

            if (*toUnicodeStatus != missingCharMarker) {
                /* Check to make sure that consonant clusters are handled correct for Gurmukhi script. */
                if (data->currentDeltaToUnicode == PNJ_DELTA && data->prevToUnicodeStatus != 0 && isPNJConsonant(data->prevToUnicodeStatus) &&
                        (*toUnicodeStatus + PNJ_DELTA) == PNJ_SIGN_VIRAMA && ((UChar32)(targetUniChar + PNJ_DELTA) == data->prevToUnicodeStatus)) {
                    /* Consonant clusters C + HALANT + C should be encoded as ADHAK + C */
                    offset = (int)(source-args->source - 3);
                    tempTargetUniChar = PNJ_ADHAK; /* This is necessary to avoid some compiler warnings. */
                    WRITE_TO_TARGET_TO_U(args,source,target,args->offsets,offset,tempTargetUniChar,0,err);
                    WRITE_TO_TARGET_TO_U(args,source,target,args->offsets,offset,data->prevToUnicodeStatus,0,err);
                    data->prevToUnicodeStatus = 0x0000; /* reset the previous unicode code point */
                    *toUnicodeStatus = missingCharMarker;
                    continue;
                } else {
                    /* Write the previous toUnicodeStatus, this was delayed to handle consonant clustering for Gurmukhi script. */
                    if (data->prevToUnicodeStatus) {
                        WRITE_TO_TARGET_TO_U(args,source,target,args->offsets,(source-args->source -1),data->prevToUnicodeStatus,0,err);
                        data->prevToUnicodeStatus = 0x0000;
                    }
                    /* Check to make sure that Bindi and Tippi are handled correctly for Gurmukhi script. 
                     * If 0xA2 is preceded by a codepoint in the PNJ_BINDI_TIPPI_SET then the target codepoint should be Tippi instead of Bindi.
                     */
                    if (data->currentDeltaToUnicode == PNJ_DELTA && (targetUniChar + PNJ_DELTA) == PNJ_BINDI && isPNJBindiTippi((*toUnicodeStatus + PNJ_DELTA))) {
                        targetUniChar = PNJ_TIPPI - PNJ_DELTA;
                        WRITE_TO_TARGET_TO_U(args,source,target,args->offsets,(source-args->source -2),*toUnicodeStatus,PNJ_DELTA,err);
                    } else if (data->currentDeltaToUnicode == PNJ_DELTA && (targetUniChar + PNJ_DELTA) == PNJ_SIGN_VIRAMA && isPNJConsonant((*toUnicodeStatus + PNJ_DELTA))) {
                        /* Store the current toUnicodeStatus code point for later handling of consonant cluster in Gurmukhi. */
                        data->prevToUnicodeStatus = *toUnicodeStatus + PNJ_DELTA;
                    } else {
                        /* write the previously mapped codepoint */
                        WRITE_TO_TARGET_TO_U(args,source,target,args->offsets,(source-args->source -2),*toUnicodeStatus,data->currentDeltaToUnicode,err);
                    }
                }
                *toUnicodeStatus = missingCharMarker;
            }

            if (targetUniChar != missingCharMarker) {
                /* now save the targetUniChar for delayed write */
                *toUnicodeStatus = (UChar) targetUniChar;
                if (data->resetToDefaultToUnicode==TRUE) {
                    data->currentDeltaToUnicode = data->defDeltaToUnicode;
                    data->currentMaskToUnicode = data->defMaskToUnicode;
                    data->resetToDefaultToUnicode=FALSE;
                }
            } else {

                /* we reach here only if targetUniChar == missingCharMarker
                 * so assign codes to reason and err
                 */
                *err = U_INVALID_CHAR_FOUND;
CALLBACK:
                args->converter->toUBytes[0] = (uint8_t) sourceChar;
                args->converter->toULength = 1;
                break;
            }

        } else {
            *err =U_BUFFER_OVERFLOW_ERROR;
            break;
        }
    }

    if (U_SUCCESS(*err) && args->flush && source == sourceLimit) {
        /* end of the input stream */
        UConverter *cnv = args->converter;

        if (*contextCharToUnicode==ATR || *contextCharToUnicode==EXT || *contextCharToUnicode==ISCII_INV) {
            /* set toUBytes[] */
            cnv->toUBytes[0] = (uint8_t)*contextCharToUnicode;
            cnv->toULength = 1;

            /* avoid looping on truncated sequences */
            *contextCharToUnicode = NO_CHAR_MARKER;
        } else {
            cnv->toULength = 0;
        }

        if (*toUnicodeStatus != missingCharMarker) {
            /* output a remaining target character */
            WRITE_TO_TARGET_TO_U(args,source,target,args->offsets,(source - args->source -1),*toUnicodeStatus,data->currentDeltaToUnicode,err);
            *toUnicodeStatus = missingCharMarker;
        }
    }

    args->target = target;
    args->source = source;
}